

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextParent(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNsPtr ns;
  xmlAttrPtr att;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    return (xmlNodePtr)0x0;
  }
  if (cur == (xmlNodePtr)0x0) {
    if (ctxt->context->node == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    switch(ctxt->context->node->type) {
    case XML_ELEMENT_NODE:
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
    case XML_ENTITY_REF_NODE:
    case XML_ENTITY_NODE:
    case XML_PI_NODE:
    case XML_COMMENT_NODE:
    case XML_NOTATION_NODE:
    case XML_DTD_NODE:
    case XML_ELEMENT_DECL:
    case XML_ATTRIBUTE_DECL:
    case XML_ENTITY_DECL:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      if (ctxt->context->node->parent == (_xmlNode *)0x0) {
        ctxt_local = (xmlXPathParserContextPtr)ctxt->context->doc;
      }
      else if ((ctxt->context->node->parent->type == XML_ELEMENT_NODE) &&
              ((*ctxt->context->node->parent->name == ' ' ||
               (iVar2 = xmlStrEqual(ctxt->context->node->parent->name,(xmlChar *)"fake node libxslt"
                                   ), iVar2 != 0)))) {
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else {
        ctxt_local = (xmlXPathParserContextPtr)ctxt->context->node->parent;
      }
      break;
    case XML_ATTRIBUTE_NODE:
      ctxt_local = (xmlXPathParserContextPtr)ctxt->context->node->parent;
      break;
    case XML_DOCUMENT_NODE:
    case XML_DOCUMENT_TYPE_NODE:
    case XML_DOCUMENT_FRAG_NODE:
    case XML_HTML_DOCUMENT_NODE:
      ctxt_local = (xmlXPathParserContextPtr)0x0;
      break;
    case XML_NAMESPACE_DECL:
      pxVar1 = ctxt->context->node;
      if ((pxVar1->_private == (void *)0x0) || (*(int *)((long)pxVar1->_private + 8) == 0x12)) {
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else {
        ctxt_local = (xmlXPathParserContextPtr)pxVar1->_private;
      }
      break;
    default:
      goto switchD_00225138_default;
    }
  }
  else {
switchD_00225138_default:
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

xmlNodePtr
xmlXPathNextParent(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    /*
     * the parent of an attribute or namespace node is the element
     * to which the attribute or namespace node is attached
     * Namespace handling !!!
     */
    if (cur == NULL) {
	if (ctxt->context->node == NULL) return(NULL);
	switch (ctxt->context->node->type) {
            case XML_ELEMENT_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
            case XML_NOTATION_NODE:
            case XML_DTD_NODE:
	    case XML_ELEMENT_DECL:
	    case XML_ATTRIBUTE_DECL:
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
	    case XML_ENTITY_DECL:
		if (ctxt->context->node->parent == NULL)
		    return((xmlNodePtr) ctxt->context->doc);
		if ((ctxt->context->node->parent->type == XML_ELEMENT_NODE) &&
		    ((ctxt->context->node->parent->name[0] == ' ') ||
		     (xmlStrEqual(ctxt->context->node->parent->name,
				 BAD_CAST "fake node libxslt"))))
		    return(NULL);
		return(ctxt->context->node->parent);
            case XML_ATTRIBUTE_NODE: {
		xmlAttrPtr att = (xmlAttrPtr) ctxt->context->node;

		return(att->parent);
	    }
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
                return(NULL);
	    case XML_NAMESPACE_DECL: {
		xmlNsPtr ns = (xmlNsPtr) ctxt->context->node;

		if ((ns->next != NULL) &&
		    (ns->next->type != XML_NAMESPACE_DECL))
		    return((xmlNodePtr) ns->next);
                return(NULL);
	    }
	}
    }
    return(NULL);
}